

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void SeedRandomStateForTest(SeedRand seedtype)

{
  int iVar1;
  char *__s;
  detail *this;
  ostream *poVar2;
  char *in_RCX;
  uint256 *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view input;
  string_view logging_function;
  char *RANDOM_CTX_SEED;
  undefined1 local_48 [32];
  bool local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  RANDOM_CTX_SEED = "RANDOM_CTX_SEED";
  if (SeedRandomStateForTest(SeedRand)::ctx_seed == '\0') {
    iVar1 = __cxa_guard_acquire(&SeedRandomStateForTest(SeedRand)::ctx_seed);
    if (iVar1 != 0) {
      __s = getenv("RANDOM_CTX_SEED");
      if (__s == (char *)0x0) {
        GetRandHash();
      }
      else {
        this = (detail *)strlen(__s);
        input._M_str = in_RCX;
        input._M_len = (size_t)__s;
        detail::FromUserHex<uint256>((optional<uint256> *)local_48,this,input);
        if (local_28 == false) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"RANDOM_CTX_SEED");
          poVar2 = std::operator<<(poVar2," must consist of up to ");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2," hex digits (\"0x\" prefix allowed), it was set to: \'");
          poVar2 = std::operator<<(poVar2,__s);
          std::operator<<(poVar2,"\'.\n");
          abort();
        }
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x10] =
             local_48[0x10];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x11] =
             local_48[0x11];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x12] =
             local_48[0x12];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x13] =
             local_48[0x13];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x14] =
             local_48[0x14];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x15] =
             local_48[0x15];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x16] =
             local_48[0x16];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x17] =
             local_48[0x17];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x18] =
             local_48[0x18];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x19] =
             local_48[0x19];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x1a] =
             local_48[0x1a];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x1b] =
             local_48[0x1b];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x1c] =
             local_48[0x1c];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x1d] =
             local_48[0x1d];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x1e] =
             local_48[0x1e];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0x1f] =
             local_48[0x1f];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0] = local_48[0];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[1] = local_48[1];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[2] = local_48[2];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[3] = local_48[3];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[4] = local_48[4];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[5] = local_48[5];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[6] = local_48[6];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[7] = local_48[7];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[8] = local_48[8];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[9] = local_48[9];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[10] = local_48[10];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0xb] = local_48[0xb];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0xc] = local_48[0xc];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0xd] = local_48[0xd];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0xe] = local_48[0xe];
        SeedRandomStateForTest::ctx_seed.super_base_blob<256U>.m_data._M_elems[0xf] = local_48[0xf];
      }
      __cxa_guard_release(&SeedRandomStateForTest(SeedRand)::ctx_seed);
    }
  }
  if (seedtype == FIXED_SEED) {
    this_00 = &SeedRandomStateForTest::ctx_seed;
  }
  else {
    this_00 = &uint256::ZERO;
  }
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_48,(base_blob<256u> *)this_00);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/random.cpp"
  ;
  source_file._M_len = 100;
  logging_function._M_str = "SeedRandomStateForTest";
  logging_function._M_len = 0x16;
  LogPrintFormatInternal<char_const*,std::__cxx11::string>
            (logging_function,source_file,0x28,ALL,Info,(ConstevalFormatString<2U>)0xc88ace,
             &RANDOM_CTX_SEED,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  MakeRandDeterministicDANGEROUS(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedRandomStateForTest(SeedRand seedtype)
{
    constexpr auto RANDOM_CTX_SEED{"RANDOM_CTX_SEED"};

    // Do this once, on the first call, regardless of seedtype, because once
    // MakeRandDeterministicDANGEROUS is called, the output of GetRandHash is
    // no longer truly random. It should be enough to get the seed once for the
    // process.
    static const uint256 ctx_seed = []() {
        // If RANDOM_CTX_SEED is set, use that as seed.
        if (const char* num{std::getenv(RANDOM_CTX_SEED)}) {
            if (auto num_parsed{uint256::FromUserHex(num)}) {
                return *num_parsed;
            } else {
                std::cerr << RANDOM_CTX_SEED << " must consist of up to " << uint256::size() * 2 << " hex digits (\"0x\" prefix allowed), it was set to: '" << num << "'.\n";
                std::abort();
            }
        }
        // Otherwise use a (truly) random value.
        return GetRandHash();
    }();

    const uint256& seed{seedtype == SeedRand::FIXED_SEED ? ctx_seed : uint256::ZERO};
    LogInfo("Setting random seed for current tests to %s=%s\n", RANDOM_CTX_SEED, seed.GetHex());
    MakeRandDeterministicDANGEROUS(seed);
}